

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command-bind.h
# Opt level: O2

CommandVoid2<dynamicgraph::Tracer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
dynamicgraph::command::
makeCommandVoid2<dynamicgraph::Tracer,std::__cxx11::string,std::__cxx11::string>
          (command *this,Tracer *entity,F function,string *docString)

{
  CommandVoid2<dynamicgraph::Tracer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  function_t local_48;
  
  this_00 = (CommandVoid2<dynamicgraph::Tracer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)operator_new(0x80);
  local_48.
  super_function2<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .super_function_base.vtable =
       (vtable_base *)
       (boost::function2<void,std::__cxx11::string_const&,std::__cxx11::string_const&>::
        assign_to<boost::_bi::bind_t<void,boost::_mfi::mf2<void,dynamicgraph::Tracer,std::__cxx11::string_const&,std::__cxx11::string_const&>,boost::_bi::list3<boost::_bi::value<dynamicgraph::Tracer*>,boost::arg<1>,boost::arg<2>>>>(boost::_bi::bind_t<void,boost::_mfi::mf2<void,dynamicgraph::Tracer,std::__cxx11::string_const&,std::__cxx11::string_const&>,boost::_bi::list3<boost::_bi::value<dynamicgraph::Tracer*>,boost::arg<int>,boost::arg<int>>>)
        ::stored_vtable_abi_cxx11_ + 1);
  local_48.
  super_function2<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .super_function_base.functor.members._0_8_ = (undefined8)entity;
  local_48.
  super_function2<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .super_function_base.functor._8_8_ = function;
  local_48.
  super_function2<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .super_function_base.functor._16_8_ = this;
  CommandVoid2<dynamicgraph::Tracer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::CommandVoid2(this_00,(Tracer *)this,&local_48,docString);
  boost::
  function2<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function2(&local_48.
                super_function2<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              );
  return this_00;
}

Assistant:

CommandVoid2<E, T1, T2> *makeCommandVoid2(E &entity,
                                          void (E::*function)(const T1 &,
                                                              const T2 &),
                                          const std::string &docString) {
  return new CommandVoid2<E, T1, T2>(
      entity, boost::bind(function, &entity, _1, _2), docString);
  return NULL;
}